

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

int import_ssh1(Filename *filename,int type,RSAKey *key,char *passphrase,char **errmsg_p)

{
  LoadedFile *lf_00;
  int toret;
  LoadedFile *lf;
  char **errmsg_p_local;
  char *passphrase_local;
  RSAKey *key_local;
  int type_local;
  Filename *filename_local;
  
  lf_00 = lf_load_keyfile(filename,errmsg_p);
  if (lf_00 == (LoadedFile *)0x0) {
    filename_local._4_4_ = 0;
  }
  else {
    filename_local._4_4_ = import_ssh1_s(lf_00->binarysource_,type,key,passphrase,errmsg_p);
    lf_free(lf_00);
  }
  return filename_local._4_4_;
}

Assistant:

int import_ssh1(const Filename *filename, int type,
                RSAKey *key, char *passphrase, const char **errmsg_p)
{
    LoadedFile *lf = lf_load_keyfile(filename, errmsg_p);
    if (!lf)
        return false;

    int toret = import_ssh1_s(BinarySource_UPCAST(lf),
                              type, key, passphrase, errmsg_p);
    lf_free(lf);
    return toret;
}